

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Result.cpp
# Opt level: O3

void __thiscall CoreML::Result::Result(Result *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"not an error","");
  this->m_type = NO_ERROR;
  this->m_reason = UNKNOWN;
  std::operator+(&this->m_message,"validator error: ",&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Result::Result()
    : Result(ResultType::NO_ERROR, ResultReason::UNKNOWN, "not an error")
  { }